

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3ca8ed::Nrom_is_cpu_address_in_range_Test::TestBody
          (Nrom_is_cpu_address_in_range_Test *this)

{
  byte bVar1;
  Mapper in_R8D;
  char *in_R9;
  AssertHelper local_200;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1f8;
  long *local_1f0;
  string local_1e8;
  AssertionResult gtest_ar_;
  string bytes;
  stringstream ss;
  
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            (&bytes,(_anonymous_namespace_ *)0x1,'\x01','\0',in_R8D);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&bytes,_S_out|_S_in);
  n_e_s::core::RomFactory::from_bytes((RomFactory *)&local_1f0,(istream *)&ss);
  gtest_ar_.success_ = (bool)(**(code **)(*local_1f0 + 0x10))(local_1f0,0x6000);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)&gtest_ar_,
               (AssertionResult *)"rom->is_cpu_address_in_range(0x6000u)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x8b,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (local_1f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1f8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)(**(code **)(*local_1f0 + 0x10))(local_1f0,0x7fff);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)&gtest_ar_,
               (AssertionResult *)"rom->is_cpu_address_in_range(0x7FFFu)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x8c,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (local_1f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1f8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)(**(code **)(*local_1f0 + 0x10))(local_1f0,0x8000);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)&gtest_ar_,
               (AssertionResult *)"rom->is_cpu_address_in_range(0x8000u)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x8d,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (local_1f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1f8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)(**(code **)(*local_1f0 + 0x10))(local_1f0,0xc000);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)&gtest_ar_,
               (AssertionResult *)"rom->is_cpu_address_in_range(0xC000u)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x8e,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (local_1f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1f8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)(**(code **)(*local_1f0 + 0x10))(local_1f0,0xffff);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)&gtest_ar_,
               (AssertionResult *)"rom->is_cpu_address_in_range(0xFFFFu)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x8f,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (local_1f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1f8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar1 = (**(code **)(*local_1f0 + 0x10))(local_1f0,0);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)&gtest_ar_,
               (AssertionResult *)"rom->is_cpu_address_in_range(0x0000u)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x91,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (local_1f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1f8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar1 = (**(code **)(*local_1f0 + 0x10))(local_1f0,0x5fff);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)&gtest_ar_,
               (AssertionResult *)"rom->is_cpu_address_in_range(0x5FFFu)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x92,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (local_1f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1f8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  if (local_1f0 != (long *)0x0) {
    (**(code **)(*local_1f0 + 8))();
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&bytes);
  return;
}

Assistant:

TEST(Nrom, is_cpu_address_in_range) {
    std::string bytes{nrom_bytes(1, 1, Mapper::Nrom)};
    std::stringstream ss(bytes);
    std::unique_ptr<IRom> rom = RomFactory::from_bytes(ss);

    EXPECT_TRUE(rom->is_cpu_address_in_range(0x6000u));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0x7FFFu));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0x8000u));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0xC000u));
    EXPECT_TRUE(rom->is_cpu_address_in_range(0xFFFFu));

    EXPECT_FALSE(rom->is_cpu_address_in_range(0x0000u));
    EXPECT_FALSE(rom->is_cpu_address_in_range(0x5FFFu));
}